

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

QDate __thiscall
QtPrivate::QCalendarDayValidator::applyToDate(QCalendarDayValidator *this,QDate date,QCalendar cal)

{
  bool bVar1;
  int *piVar2;
  long in_RDI;
  long in_FS_OFFSET;
  YearMonthDay parts;
  QDate *in_stack_ffffffffffffff90;
  int local_50 [2];
  YearMonthDay local_48;
  YearMonthDay local_30;
  YearMonthDay local_20;
  qint64 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_30._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_30.day = -0x55555556;
  local_48 = (YearMonthDay)QCalendar::partsFromDate((QDate *)&local_20);
  local_30 = local_48;
  bVar1 = QCalendar::YearMonthDay::isValid(&local_30);
  if (bVar1) {
    local_50[1] = 1;
    piVar2 = qMax<int>(local_50 + 1,(int *)(in_RDI + 0x14));
    local_50[0] = QCalendar::daysInMonth((int)&local_20,local_30.month);
    piVar2 = qMin<int>(piVar2,local_50);
    local_30.day = *piVar2;
    local_10 = QCalendar::dateFromParts(&local_20);
  }
  else {
    QDate::QDate(in_stack_ffffffffffffff90);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDate)local_10;
  }
  __stack_chk_fail();
}

Assistant:

QDate QCalendarDayValidator::applyToDate(QDate date, QCalendar cal) const
{
    auto parts = cal.partsFromDate(date);
    if (!parts.isValid())
        return QDate();
    parts.day = qMin(qMax(1, m_day), cal.daysInMonth(parts.month, parts.year));
    return cal.dateFromParts(parts);
}